

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

_Bool sx_strequal(char *a,char *b)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int i;
  int blen;
  int alen;
  char *b_local;
  char *a_local;
  
  iVar1 = sx_strlen(a);
  iVar2 = sx_strlen(b);
  if (iVar1 == iVar2) {
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      if (a[local_2c] != b[local_2c]) {
        return false;
      }
    }
    a_local._7_1_ = true;
  }
  else {
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool sx_strequal(const char* SX_RESTRICT a, const char* SX_RESTRICT b)
{
    int alen = sx_strlen(a);
    int blen = sx_strlen(b);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (a[i] != b[i])
            return false;
    }
    return true;
}